

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O0

void write_into_file(FILE *outfile,char *opt,char *arg,char **values)

{
  long in_RCX;
  long in_RDX;
  char **in_RSI;
  FILE *in_RDI;
  int found;
  int local_24;
  
  local_24 = -1;
  if (in_RDX == 0) {
    fprintf(in_RDI,"%s\n",in_RSI);
  }
  else {
    if (in_RCX != 0) {
      local_24 = check_possible_values((char *)in_RDI,in_RSI);
    }
    if (local_24 < 0) {
      fprintf(in_RDI,"%s=\"%s\"\n",in_RSI,in_RDX);
    }
    else {
      fprintf(in_RDI,"%s=\"%s\" # %s\n",in_RSI,in_RDX,*(undefined8 *)(in_RCX + (long)local_24 * 8));
    }
  }
  return;
}

Assistant:

static void
write_into_file(FILE *outfile, const char *opt, const char *arg, const char *values[])
{
  int found = -1;
  if (arg) {
    if (values) {
      found = check_possible_values(arg, values);      
    }
    if (found >= 0)
      fprintf(outfile, "%s=\"%s\" # %s\n", opt, arg, values[found]);
    else
      fprintf(outfile, "%s=\"%s\"\n", opt, arg);
  } else {
    fprintf(outfile, "%s\n", opt);
  }
}